

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void iutest::detail::
     TypeParameterizedTestSuite<TypeParamTest,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::StaticMul2,_iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>,_iutest::detail::TypeList1<float>_>
     ::
     EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::StaticMul2,_iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>_>
     ::Register(TestSuite *testsuite,char *test_names)

{
  undefined1 *puVar1;
  char *pcVar2;
  EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::StaticMul2,_iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>_>
  *this;
  long lVar3;
  undefined1 *puVar4;
  iuPool *this_00;
  string test_name;
  string local_1d8;
  undefined1 local_1b8 [400];
  
  if (test_names == (char *)0x0) {
    IUTestLog::IUTestLog
              ((IUTestLog *)local_1b8,LOG_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
               ,0x1f9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"Condition test_names != NULL failed. ",0x25);
    IUTestLog::~IUTestLog((IUTestLog *)local_1b8);
    test_names = (char *)0x0;
  }
  else {
    for (; (*test_names == ' ' || (*test_names == '\t')); test_names = test_names + 1) {
    }
  }
  pcVar2 = strchr(test_names,0x2c);
  puVar1 = local_1b8 + 0x10;
  local_1b8._8_8_ = 0;
  local_1b8[0x10] = 0;
  local_1b8._0_8_ = puVar1;
  if (pcVar2 == (char *)0x0) {
    strlen(test_names);
    pcVar2 = (char *)0x0;
    std::__cxx11::string::_M_replace((ulong)local_1b8,0,(char *)0x0,(ulong)test_names);
  }
  else {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,test_names,pcVar2);
    std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = pcVar2 + 1;
  }
  this = (EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::StaticMul2,_iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>_>
          *)operator_new(0xd8);
  lVar3 = local_1b8._8_8_;
  if ((undefined1 *)(local_1b8._0_8_ + local_1b8._8_8_ + -1) == (undefined1 *)local_1b8._0_8_) {
LAB_0031e0d0:
    puVar4 = (undefined1 *)(local_1b8._0_8_ + lVar3);
  }
  else {
    puVar4 = (undefined1 *)(local_1b8._0_8_ + 1);
    do {
      if ((*(char *)(local_1b8._0_8_ + lVar3 + -1) != ' ') &&
         (*(char *)(local_1b8._0_8_ + lVar3 + -1) != '\t')) goto LAB_0031e0d0;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 1);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_1d8,local_1b8._0_8_,puVar4);
  EachTest(this,testsuite,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  this_00 = iuPool::GetInstance();
  iuPool::push(this_00,(value_ptr)this);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    for (; (*pcVar2 == ' ' || (*pcVar2 == '\t')); pcVar2 = pcVar2 + 1) {
    }
  }
  EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>_>
  ::Register(testsuite,pcVar2);
  if ((undefined1 *)local_1b8._0_8_ != puVar1) {
    operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  }
  return;
}

Assistant:

static void Register(TestSuite* testsuite, const char* test_names)
        {
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
            IUTEST_CHECK_(test_names != NULL);
            const char* str = detail::SkipSpace(test_names);
            const char* comma = strchr(str, ',');
            ::std::string test_name;
            if( comma == NULL )
            {
                test_name = str;
            }
            else
            {
                test_name = ::std::string(str, static_cast<size_t>(comma - str));
                ++comma;
            }
            _Myt* test = new EachTest(testsuite, StripTrailingSpace(test_name));
            // new オブジェクトを管理してもらう
            detail::iuPool::GetInstance().push(test);

            EachTest<TypeParam, typename TestsList::Tail>::Register(testsuite, detail::SkipSpace(comma));
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
        }